

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O0

void __thiscall OStreamTest_Print_Test::~OStreamTest_Print_Test(OStreamTest_Print_Test *this)

{
  void *in_RDI;
  
  ~OStreamTest_Print_Test((OStreamTest_Print_Test *)0x116628);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(OStreamTest, Print) {
  std::ostringstream os;
  fmt::print(os, "Don't {}!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  std::wostringstream wos;
  fmt::print(wos, L"Don't {}!", L"panic");
  EXPECT_EQ(L"Don't panic!", wos.str());
}